

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::ShadeVertsTransformPos
               (ImDrawList *draw_list,int vert_start_idx,int vert_end_idx,ImVec2 *pivot_in,
               float cos_a,float sin_a,ImVec2 *pivot_out)

{
  long lVar1;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  ImVec2 IVar2;
  ImDrawVert *vertex;
  ImDrawVert *vert_end;
  ImDrawVert *vert_start;
  ImVec2 in_stack_ffffffffffffffa8;
  ImVec2 *local_40;
  
  lVar1 = *(long *)(in_RDI + 0x28);
  for (local_40 = (ImVec2 *)(*(long *)(in_RDI + 0x28) + (long)in_ESI * 0x14);
      local_40 < (ImVec2 *)(lVar1 + (long)in_EDX * 0x14); local_40 = (ImVec2 *)&local_40[2].y) {
    in_stack_ffffffffffffffa8 = ::operator-((ImVec2 *)in_stack_ffffffffffffffa8,(ImVec2 *)0x228780);
    ImRotate((ImVec2 *)in_stack_ffffffffffffffa8,0.0,3.17105e-39);
    IVar2 = ::operator+((ImVec2 *)in_stack_ffffffffffffffa8,(ImVec2 *)0x2287ae);
    *local_40 = IVar2;
  }
  return;
}

Assistant:

void ImGui::ShadeVertsTransformPos(ImDrawList* draw_list, int vert_start_idx, int vert_end_idx, const ImVec2& pivot_in, float cos_a, float sin_a, const ImVec2& pivot_out)
{
    ImDrawVert* vert_start = draw_list->VtxBuffer.Data + vert_start_idx;
    ImDrawVert* vert_end = draw_list->VtxBuffer.Data + vert_end_idx;
    for (ImDrawVert* vertex = vert_start; vertex < vert_end; ++vertex)
        vertex->pos = ImRotate(vertex->pos- pivot_in, cos_a, sin_a) + pivot_out;
}